

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O2

uint __thiscall
Kernel::Signature::addFreshFunction(Signature *this,uint arity,char *prefix,char *suffix)

{
  undefined1 *puVar1;
  uint uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined8 extraout_RDX_01;
  bool added;
  string suf;
  string pref;
  bool local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,prefix,(allocator<char> *)&local_b0);
  if (suffix == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"",(allocator<char> *)&local_d0);
    uVar3 = extraout_RDX_00;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"_",(allocator<char> *)&local_70);
    std::operator+(&local_b0,&local_d0,suffix);
    std::__cxx11::string::~string((string *)&local_d0);
    uVar3 = extraout_RDX;
  }
  do {
    uVar2 = this->_nextFreshSymbolNumber;
    this->_nextFreshSymbolNumber = uVar2 + 1;
    Lib::Int::toString_abi_cxx11_(&local_50,(Int *)(ulong)uVar2,(int)uVar3);
    std::operator+(&local_70,&local_90,&local_50);
    std::operator+(&local_d0,&local_70,&local_b0);
    uVar2 = addFunction(this,&local_d0,arity,&local_d1);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = extraout_RDX_01;
  } while (local_d1 != true);
  puVar1 = &(this->_funs)._stack[uVar2]->field_0x40;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x14;
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return uVar2;
}

Assistant:

unsigned Signature::addFreshFunction(unsigned arity, const char* prefix, const char* suffix)
{
  std::string pref(prefix);
  std::string suf(suffix ? std::string("_")+suffix : "");
  bool added;
  unsigned result;
  //commented out because it could lead to introduction of function with the same name
  //that differ only in arity (which is OK with tptp, but iProver was complaining when
  //using Vampire as clausifier)
//  unsigned result = addFunction(pref+suf,arity,added);
//  if (!added) {
    do {
      result = addFunction(pref+Int::toString(_nextFreshSymbolNumber++)+suf,arity,added);
    }
    while (!added);
//  }
  Symbol* sym = getFunction(result);
  sym->markIntroduced();
  sym->markSkip();
  return result;
}